

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

void __thiscall cm::String::String(String *this,char *d,size_type s)

{
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_type local_20;
  size_type s_local;
  char *d_local;
  String *this_local;
  
  local_20 = s;
  s_local = (size_type)d;
  d_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,d,s,&local_41);
  String<std::__cxx11::string,void>(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

String(const char* d, size_type s)
    : String(std::string(d, s))
  {
  }